

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  bool bVar1;
  cmFileLockResult cVar2;
  pointer ppcVar3;
  
  ppcVar3 = (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppcVar3 ==
        (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cVar2 = cmFileLockResult::MakeOk();
      return cVar2;
    }
    bVar1 = cmFileLock::IsLocked(*ppcVar3,filename);
    if (bVar1) break;
    ppcVar3 = ppcVar3 + 1;
  }
  cVar2 = cmFileLock::Release(*ppcVar3);
  return cVar2;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
  const std::string& filename)
{
  for (It i = this->Locks.begin(); i != this->Locks.end(); ++i) {
    if ((*i)->IsLocked(filename)) {
      return (*i)->Release();
    }
  }
  return cmFileLockResult::MakeOk();
}